

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

ElementPtr __thiscall
Rml::Element::ReplaceChild(Element *this,ElementPtr *inserted_element,Element *replaced_element)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  pointer this_00;
  pointer pEVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  int local_84;
  Element *pEStack_80;
  int i;
  Element *ancestor;
  const_iterator local_68;
  unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> local_50;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_48;
  pointer local_40;
  Element *inserted_element_ptr;
  __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
  local_30;
  iterator insertion_point;
  Element *replaced_element_local;
  ElementPtr *inserted_element_local;
  Element *this_local;
  ElementPtr *result;
  
  insertion_point._M_current =
       (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
       CONCAT71(in_register_00000009,in_CL);
  bVar2 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)replaced_element);
  if ((!bVar2) &&
     (bVar2 = Assert("RMLUI_ASSERT(inserted_element)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x582), !bVar2)) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  local_30._M_current =
       (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
       ::std::
       vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
       ::begin((vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                *)(inserted_element + 3));
  while( true ) {
    inserted_element_ptr =
         (Element *)
         ::std::
         vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
         ::end((vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                *)(inserted_element + 3));
    bVar3 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                        *)&inserted_element_ptr);
    bVar2 = false;
    if (bVar3) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
                ::operator->(&local_30);
      pEVar4 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(this_00);
      bVar2 = pEVar4 != (pointer)insertion_point._M_current;
    }
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_*,_std::vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>_>
    ::operator++(&local_30);
  }
  local_40 = ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get
                       ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)replaced_element);
  local_48._M_current =
       (unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)
       ::std::
       vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
       ::end((vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
              *)(inserted_element + 3));
  bVar2 = __gnu_cxx::operator==(&local_30,&local_48);
  if (bVar2) {
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::unique_ptr
              (&local_50,(unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)replaced_element)
    ;
    AppendChild((Element *)inserted_element,&local_50,true);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr(&local_50);
    ::std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>::
    unique_ptr<Rml::Releaser<Rml::Element>,void>
              ((unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>> *)this,(nullptr_t)0x0);
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
    ::__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>*>
              ((__normal_iterator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>const*,std::vector<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>,std::allocator<std::unique_ptr<Rml::Element,Rml::Releaser<Rml::Element>>>>>
                *)&local_68,&local_30);
    ::std::
    vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
    ::insert((vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
              *)(inserted_element + 3),local_68,(value_type *)replaced_element);
    SetParent(local_40,(Element *)inserted_element);
    RemoveChild(this,(Element *)inserted_element);
    local_84 = 0;
    for (pEStack_80 = local_40; local_84 < 3 && pEStack_80 != (Element *)0x0;
        pEStack_80 = GetParentNode(pEStack_80)) {
      (*(pEStack_80->super_ScriptInterface).super_Releasable._vptr_Releasable[0x13])
                (pEStack_80,local_40);
      local_84 = local_84 + 1;
    }
  }
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::ReplaceChild(ElementPtr inserted_element, Element* replaced_element)
{
	RMLUI_ASSERT(inserted_element);
	auto insertion_point = children.begin();
	while (insertion_point != children.end() && insertion_point->get() != replaced_element)
	{
		++insertion_point;
	}

	Element* inserted_element_ptr = inserted_element.get();

	if (insertion_point == children.end())
	{
		AppendChild(std::move(inserted_element));
		return nullptr;
	}

	children.insert(insertion_point, std::move(inserted_element));
	inserted_element_ptr->SetParent(this);

	ElementPtr result = RemoveChild(replaced_element);

	Element* ancestor = inserted_element_ptr;
	for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
		ancestor->OnChildAdd(inserted_element_ptr);

	return result;
}